

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

void Cloud_PrintHashTable(CloudManager *dd)

{
  long lVar1;
  long lVar2;
  
  if (0 < dd->nNodesAlloc) {
    lVar1 = 4;
    lVar2 = 0;
    do {
      putchar((uint)(*(int *)((long)&dd->tUnique->s + lVar1) == 0xfffffff) * 2 + 0x2b);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < dd->nNodesAlloc);
  }
  putchar(10);
  return;
}

Assistant:

void Cloud_PrintHashTable( CloudManager * dd )
{
	int i;

	for ( i = 0; i < dd->nNodesAlloc; i++ )
		if ( dd->tUnique[i].v == CLOUD_CONST_INDEX )
			printf( "-" );
		else
			printf( "+" );
	printf( "\n" );
}